

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestBufferStream(void)

{
  bool bVar1;
  OutputBuffer *this;
  const_string *file;
  size_type line_num;
  const_string *msg;
  long lVar2;
  OutputBuffer *buf;
  int i;
  ostream os;
  string junk;
  lazy_ostream *in_stack_fffffffffffffd28;
  basic_cstring<const_char> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  begin *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd58;
  begin *b;
  unit_test_log_t *in_stack_fffffffffffffda0;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  undefined1 local_238 [56];
  basic_cstring<const_char> local_200;
  OutputBuffer *local_1f0;
  int local_1e4;
  ostream local_1e0;
  string local_80 [80];
  basic_cstring<const_char> local_30;
  begin local_20;
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  b = &local_20;
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffd40,(const_string *)in_stack_fffffffffffffd38,
             (size_t)in_stack_fffffffffffffd30);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffda0,b);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffd38,
             (log_level)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [17])in_stack_fffffffffffffd30);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]> *)
             0x231c7c);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffd30);
  makeString_abi_cxx11_(in_stack_fffffffffffffd58);
  avro::ostream::ostream((ostream *)in_stack_fffffffffffffd40);
  for (local_1e4 = 0; local_1e4 < 3; local_1e4 = local_1e4 + 1) {
    std::operator<<(&local_1e0,local_80);
  }
  this = avro::ostream::getBuffer((ostream *)0x231d77);
  local_1f0 = this;
  file = (const_string *)std::operator<<((ostream *)&std::cout,"Buffer has ");
  line_num = avro::OutputBuffer::size((OutputBuffer *)0x231db2);
  msg = (const_string *)std::ostream::operator<<(file,line_num);
  std::operator<<((ostream *)msg," bytes\n");
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint((unit_test_log_t *)this,file,line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_258.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x231e8a);
    lVar2 = std::__cxx11::string::size();
    local_258.m_begin = (iterator)(lVar2 * local_1e4);
    in_stack_fffffffffffffd38 = "junk.size() * i";
    in_stack_fffffffffffffd30 = &local_258;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_238,&local_248,0x1a5,1,2,&local_258.m_end,"buf.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x231f1f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::ostream::~ostream((ostream *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestBufferStream()
{
    BOOST_TEST_MESSAGE( "TestBufferStream");

    {
        // write enough bytes to a buffer, to create at least 3 blocks
        std::string junk = makeString(kDefaultBlockSize);
        ostream os;
        int i = 0;
        for(; i < 3; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";
        BOOST_CHECK_EQUAL(buf.size(), junk.size() * i);
    }
}